

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

MapinfoEdMapItem * __thiscall
TMap<int,_MapinfoEdMapItem,_THashTraits<int>,_TValueTraits<MapinfoEdMapItem>_>::Insert
          (TMap<int,_MapinfoEdMapItem,_THashTraits<int>,_TValueTraits<MapinfoEdMapItem>_> *this,
          int key,MapinfoEdMapItem *value)

{
  Node *local_28;
  Node *n;
  MapinfoEdMapItem *value_local;
  int key_local;
  TMap<int,_MapinfoEdMapItem,_THashTraits<int>,_TValueTraits<MapinfoEdMapItem>_> *this_local;
  
  local_28 = FindKey(this,key);
  if (local_28 == (Node *)0x0) {
    local_28 = NewKey(this,key);
    MapinfoEdMapItem::MapinfoEdMapItem(&(local_28->Pair).Value,value);
  }
  else {
    MapinfoEdMapItem::operator=(&(local_28->Pair).Value,value);
  }
  return &(local_28->Pair).Value;
}

Assistant:

VT &Insert(const KT key, const VT &value)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			n->Pair.Value = value;
		}
		else
		{
			n = NewKey(key);
			::new(&n->Pair.Value) VT(value);
		}
		return n->Pair.Value;
	}